

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateBottomHeaderGuard
          (FileGenerator *this,Printer *printer,bool pb_h)

{
  Options *in_R8;
  string local_78;
  undefined1 local_58 [8];
  Formatter format;
  bool pb_h_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = pb_h;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  IncludeGuard_abi_cxx11_
            (&local_78,(cpp *)this->file_,
             (FileDescriptor *)
             (ulong)(format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1),
             (bool)((char)this + '8'),in_R8);
  Formatter::operator()
            ((Formatter *)local_58,"#endif  // $GOOGLE_PROTOBUF$_INCLUDED_$1$\n",&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void FileGenerator::GenerateBottomHeaderGuard(io::Printer* printer, bool pb_h) {
  Formatter format(printer, variables_);
  format("#endif  // $GOOGLE_PROTOBUF$_INCLUDED_$1$\n",
         IncludeGuard(file_, pb_h, options_));
}